

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O2

void __thiscall p2t::Triangle::ClearNeighbor(Triangle *this,Triangle *triangle)

{
  long lVar1;
  
  lVar1 = 0x20;
  if (this->neighbors_[0] != triangle) {
    lVar1 = (ulong)(this->neighbors_[1] != triangle) * 8 + 0x28;
  }
  *(undefined8 *)(this->constrained_edge + lVar1) = 0;
  return;
}

Assistant:

void Triangle::ClearNeighbor(const Triangle *triangle )
{
    if( neighbors_[0] == triangle )
    {
        neighbors_[0] = NULL;
    }
    else if( neighbors_[1] == triangle )
    {
        neighbors_[1] = NULL;
    }
    else
    {
        neighbors_[2] = NULL;
    }
}